

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_optimizeRational(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,bool *interrupt)

{
  undefined1 *puVar1;
  double dVar2;
  Status SVar3;
  Settings *pSVar4;
  bool bVar5;
  undefined8 extraout_RAX;
  Verbosity old_verbosity;
  char cVar6;
  Verbosity old_verbosity_7;
  byte bVar7;
  Verbosity old_verbosity_1;
  Verbosity VVar8;
  int iVar9;
  bool error;
  bool stoppedIter;
  bool hasUnboundedRay;
  bool infeasible;
  bool stoppedTime;
  char local_18c;
  bool unbounded;
  bool dualFeasible;
  bool primalFeasible;
  SPxOut *local_188;
  uint local_17c;
  SolRational *local_178;
  int local_170;
  uint local_16c;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_168;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_160;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_158;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_150;
  SolRational solUnbounded;
  uint local_68 [8];
  undefined5 local_48;
  undefined3 uStack_43;
  int local_40;
  bool local_3c;
  undefined8 local_38;
  
  hasUnboundedRay = false;
  (*this->_statistics->solvingTime->_vptr_Timer[3])();
  (*this->_statistics->preprocessingTime->_vptr_Timer[3])();
  (*this->_statistics->initialPrecisionTime->_vptr_Timer[3])();
  this->_lastSolveMode = 2;
  this->_statistics->precBoosts = 0;
  if (this->_isRealLPLoaded == false) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::loadLP(&this->_solver,this->_realLP,true);
    free(this->_realLP);
    this->_realLP =
         &(this->_solver).
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    this->_isRealLPLoaded = true;
  }
  else if (this->_hasBasis == true) {
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::reSize(&this->_basisStatusRows,
             (this->_realLP->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::reSize(&this->_basisStatusCols,
             (this->_realLP->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getBasis(&this->_solver,(this->_basisStatusRows).data,(this->_basisStatusCols).data,
               (this->_basisStatusRows).thesize,(this->_basisStatusCols).thesize);
  }
  _storeLPReal(this);
  pSVar4 = this->_currentSettings;
  dVar2 = pSVar4->_realParamValues[6];
  if (((-dVar2 < pSVar4->_realParamValues[8]) ||
      (pSVar4->_realParamValues[9] <= dVar2 && dVar2 != pSVar4->_realParamValues[9])) &&
     (VVar8 = (this->spxout).m_verbosity, 3 < (int)VVar8)) {
    (this->spxout).m_verbosity = INFO2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[4],"Deactivating objective limit.\n",0x1e);
    (this->spxout).m_verbosity = VVar8;
  }
  local_38 = 0xa00000000;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[6] = 0;
  local_68[7] = 0;
  local_48 = 0;
  uStack_43 = 0;
  local_40 = 0;
  local_3c = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_68,this->_currentSettings->_realParamValues[6]);
  (this->_solver).objLimit.m_backend.data._M_elems[0] = local_68[0];
  (this->_solver).objLimit.m_backend.data._M_elems[1] = local_68[1];
  (this->_solver).objLimit.m_backend.data._M_elems[2] = local_68[2];
  (this->_solver).objLimit.m_backend.data._M_elems[3] = local_68[3];
  (this->_solver).objLimit.m_backend.data._M_elems[4] = local_68[4];
  (this->_solver).objLimit.m_backend.data._M_elems[5] = local_68[5];
  (this->_solver).objLimit.m_backend.data._M_elems[6] = local_68[6];
  (this->_solver).objLimit.m_backend.data._M_elems[7] = local_68[7];
  *(ulong *)((this->_solver).objLimit.m_backend.data._M_elems + 8) = CONCAT35(uStack_43,local_48);
  (this->_solver).objLimit.m_backend.exp = local_40;
  (this->_solver).objLimit.m_backend.neg = local_3c;
  (this->_solver).objLimit.m_backend.fpclass = (undefined4)local_38;
  (this->_solver).objLimit.m_backend.prec_elem = local_38._4_4_;
  (*this->_statistics->preprocessingTime->_vptr_Timer[4])();
  if (this->_currentSettings->_boolParamValues[0] == true) {
    _lift(this);
  }
  pSVar4 = this->_currentSettings;
  local_16c = pSVar4->_intParamValues[1];
  if ((DAT_006b8d84 < 2) && (0 < DAT_006b8df4)) {
    pSVar4->_intParamValues[1] = 1;
  }
  local_160 = &this->_solver;
  local_170 = pSVar4->_intParamValues[0xe];
  if (((local_170 == 3) && (DAT_006b8db8 < 3)) && (1 < DAT_006b8e28)) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setTester(local_160,
                &(this->_ratiotesterFast).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,false);
    this->_currentSettings->_intParamValues[0xe] = 2;
  }
  if (this->_currentSettings->_boolParamValues[1] == true) {
    _transformEquality(this);
  }
  this->_storedBasis = false;
  local_178 = &this->_solRational;
  local_168 = &(this->_solRational)._primalRay;
  local_188 = &this->spxout;
  local_150 = &(this->_solRational)._dual;
  local_158 = &(this->_solRational)._redCost;
  bVar7 = 0;
  local_17c = 0;
  do {
    primalFeasible = false;
    dualFeasible = false;
    infeasible = false;
    unbounded = false;
    error = false;
    stoppedTime = false;
    stoppedIter = false;
    this->_certificateMode = 0;
    _performOptIRWrapper
              (this,local_178,(bool)(~bVar7 & 1),(bool)(~(byte)local_17c & 1),0,&primalFeasible,
               &dualFeasible,&infeasible,&unbounded,&stoppedTime,&stoppedIter,&error);
    if (error == true) {
      this->_status = ERROR;
LAB_0034e564:
      iVar9 = 2;
    }
    else {
      if (stoppedTime == true) {
        this->_status = ABORT_TIME;
        goto LAB_0034e564;
      }
      if (stoppedIter == true) {
        this->_status = ABORT_ITER;
        goto LAB_0034e564;
      }
      if (((bVar7 & 1) == 0) && (unbounded != false)) {
        SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::SolBase(&solUnbounded);
        this->_certificateMode = 2;
        _performUnboundedIRStable
                  (this,&solUnbounded,&hasUnboundedRay,&stoppedTime,&stoppedIter,&error);
        if (error == true) {
          VVar8 = (this->spxout).m_verbosity;
          if (2 < (int)VVar8) {
            (this->spxout).m_verbosity = INFO1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->spxout).m_streams[3],"Error while testing for unboundedness.\n",0x27);
LAB_0034e60f:
            (this->spxout).m_verbosity = VVar8;
          }
LAB_0034e613:
          this->_status = ERROR;
          goto LAB_0034e7fc;
        }
        if (hasUnboundedRay == true) {
          VVar8 = (this->spxout).m_verbosity;
          if (2 < (int)VVar8) {
            (this->spxout).m_verbosity = INFO1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->spxout).m_streams[3],
                       "Dual infeasible.  Primal unbounded ray available.\n",0x32);
LAB_0034e7c8:
            (this->spxout).m_verbosity = VVar8;
          }
        }
        else {
          VVar8 = (this->spxout).m_verbosity;
          if (2 < (int)VVar8) {
            (this->spxout).m_verbosity = INFO1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->spxout).m_streams[3],
                       "Dual feasible.  Rejecting primal unboundedness.\n",0x30);
            goto LAB_0034e7c8;
          }
        }
        bVar7 = hasUnboundedRay ^ 1;
        if (stoppedTime == true) {
LAB_0034e7df:
          this->_status = ABORT_TIME;
          goto LAB_0034e7fc;
        }
        if (stoppedIter == true) {
LAB_0034e7f2:
          this->_status = ABORT_ITER;
          goto LAB_0034e7fc;
        }
        this->_certificateMode = 1;
        _performFeasIRStable(this,local_178,&infeasible,&stoppedTime,&stoppedIter,&error);
        if (hasUnboundedRay == true) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator=(local_168,&solUnbounded._primalRay);
          puVar1 = &(this->_solRational).field_0xd0;
          *puVar1 = *puVar1 | 2;
        }
        if (error == true) {
          VVar8 = (this->spxout).m_verbosity;
          if (2 < (int)VVar8) {
            (this->spxout).m_verbosity = INFO1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->spxout).m_streams[3],"Error while testing for feasibility.\n",0x25);
            goto LAB_0034e60f;
          }
          goto LAB_0034e613;
        }
        if (stoppedTime == true) goto LAB_0034e7df;
        if (stoppedIter == true) goto LAB_0034e7f2;
        if (infeasible == true) {
          VVar8 = (this->spxout).m_verbosity;
          if (2 < (int)VVar8) {
            (this->spxout).m_verbosity = INFO1;
            soplex::operator<<(local_188,"Primal infeasible.  Dual Farkas ray available.\n");
            (this->spxout).m_verbosity = VVar8;
          }
          this->_status = INFEASIBLE;
LAB_0034e7fc:
          iVar9 = 2;
        }
        else {
          if (hasUnboundedRay == true) {
            VVar8 = (this->spxout).m_verbosity;
            if (2 < (int)VVar8) {
              (this->spxout).m_verbosity = INFO1;
              soplex::operator<<(local_188,"Primal feasible and unbounded.\n");
              (this->spxout).m_verbosity = VVar8;
            }
            this->_status = UNBOUNDED;
            goto LAB_0034e7fc;
          }
          VVar8 = (this->spxout).m_verbosity;
          iVar9 = 3;
          if (2 < (int)VVar8) {
            (this->spxout).m_verbosity = INFO1;
            soplex::operator<<(local_188,"Primal feasible and bounded.\n");
            (this->spxout).m_verbosity = VVar8;
          }
        }
        SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::~SolBase(&solUnbounded);
      }
      else {
        if (((local_17c & 1) == 0) && (infeasible != false)) {
          _storeBasis(this);
          this->_certificateMode = 1;
          _performFeasIRStable(this,local_178,&infeasible,&stoppedTime,&stoppedIter,&error);
          if (error == true) {
            VVar8 = (this->spxout).m_verbosity;
            if (2 < (int)VVar8) {
              (this->spxout).m_verbosity = INFO1;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((this->spxout).m_streams[3],"Error while testing for infeasibility.\n",0x27
                        );
              (this->spxout).m_verbosity = VVar8;
            }
            this->_status = ERROR;
          }
          else {
            local_17c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),infeasible) ^ 1;
            if (stoppedTime == true) {
              this->_status = ABORT_TIME;
            }
            else {
              if (stoppedIter != true) {
                if ((infeasible != false) && (this->_currentSettings->_boolParamValues[2] == true))
                {
                  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::SolBase(&solUnbounded);
                  this->_certificateMode = 2;
                  _performUnboundedIRStable
                            (this,&solUnbounded,&hasUnboundedRay,&stoppedTime,&stoppedIter,&error);
                  cVar6 = error;
                  if (error == true) {
                    VVar8 = (this->spxout).m_verbosity;
                    if (2 < (int)VVar8) {
                      (this->spxout).m_verbosity = INFO1;
                      soplex::operator<<(local_188,"Error while testing for dual infeasibility.\n");
                      (this->spxout).m_verbosity = VVar8;
                    }
                    this->_status = ERROR;
                    iVar9 = 2;
                    _restoreBasis(this);
                  }
                  else {
                    if (hasUnboundedRay == true) {
                      VVar8 = (this->spxout).m_verbosity;
                      if (2 < (int)VVar8) {
                        (this->spxout).m_verbosity = INFO1;
                        soplex::operator<<(local_188,
                                           "Dual infeasible.  Primal unbounded ray available.\n");
                        (this->spxout).m_verbosity = VVar8;
                      }
                      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      ::operator=(local_168,&solUnbounded._primalRay);
                      puVar1 = &(this->_solRational).field_0xd0;
                      *puVar1 = *puVar1 | 2;
                    }
                    else {
                      if ((solUnbounded._208_1_ & 4) == 0) {
                        local_18c = error;
                        VVar8 = (this->spxout).m_verbosity;
                        iVar9 = 0;
                        if (2 < (int)VVar8) {
                          (this->spxout).m_verbosity = INFO1;
                          soplex::operator<<(local_188,"Not dual infeasible.\n");
                          (this->spxout).m_verbosity = VVar8;
                          cVar6 = local_18c;
                        }
                        goto LAB_0034eaff;
                      }
                      VVar8 = (this->spxout).m_verbosity;
                      if (2 < (int)VVar8) {
                        (this->spxout).m_verbosity = INFO1;
                        soplex::operator<<(local_188,"Dual feasible.  Storing dual multipliers.\n");
                        (this->spxout).m_verbosity = VVar8;
                      }
                      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      ::operator=(local_150,&solUnbounded._dual);
                      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      ::operator=(local_158,&solUnbounded._redCost);
                      puVar1 = &(this->_solRational).field_0xd0;
                      *puVar1 = *puVar1 | 4;
                    }
                    iVar9 = 0;
                  }
LAB_0034eaff:
                  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::~SolBase(&solUnbounded);
                  if (cVar6 != '\0') goto LAB_0034e56a;
                }
                _restoreBasis(this);
                if (infeasible == true) {
                  VVar8 = (this->spxout).m_verbosity;
                  if (2 < (int)VVar8) {
                    (this->spxout).m_verbosity = INFO1;
                    soplex::operator<<(local_188,"Primal infeasible.  Dual Farkas ray available.\n")
                    ;
                    (this->spxout).m_verbosity = VVar8;
                  }
                  this->_status = INFEASIBLE;
                }
                else {
                  if (hasUnboundedRay != true) {
                    VVar8 = (this->spxout).m_verbosity;
                    iVar9 = 3;
                    if (2 < (int)VVar8) {
                      (this->spxout).m_verbosity = INFO1;
                      soplex::operator<<(local_188,"Primal feasible.  Optimizing again.\n");
                      goto LAB_0034e76b;
                    }
                    goto LAB_0034e56a;
                  }
                  VVar8 = (this->spxout).m_verbosity;
                  if (2 < (int)VVar8) {
                    (this->spxout).m_verbosity = INFO1;
                    soplex::operator<<(local_188,"Primal feasible and unbounded.\n");
                    (this->spxout).m_verbosity = VVar8;
                  }
                  this->_status = UNBOUNDED;
                }
                goto LAB_0034e564;
              }
              this->_status = ABORT_ITER;
            }
          }
          _restoreBasis(this);
          goto LAB_0034e564;
        }
        if ((primalFeasible == true) && (dualFeasible == true)) {
          VVar8 = (this->spxout).m_verbosity;
          if (2 < (int)VVar8) {
            (this->spxout).m_verbosity = INFO1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->spxout).m_streams[3],"Solved to optimality.\n",0x16);
            (this->spxout).m_verbosity = VVar8;
          }
          this->_status = OPTIMAL;
          goto LAB_0034e564;
        }
        VVar8 = (this->spxout).m_verbosity;
        iVar9 = 2;
        if (2 < (int)VVar8) {
          (this->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->spxout).m_streams[3],"Terminating without success.\n",0x1d);
          iVar9 = 2;
LAB_0034e76b:
          (this->spxout).m_verbosity = VVar8;
        }
      }
    }
LAB_0034e56a:
    if ((iVar9 == 2) || (bVar5 = _isSolveStopped(this,&stoppedTime,&stoppedIter), bVar5)) {
      this->_switchedToBoosted = false;
      this->_hasOldBasis = false;
      this->_hasOldFeasBasis = false;
      this->_hasOldUnbdBasis = false;
      if ((uint)(this->_status + RUNNING) < 3) {
        this->_hasSolRational = true;
      }
      if (this->_currentSettings->_boolParamValues[1] == true) {
        _untransformEquality(this,local_178);
      }
      if (((local_16c < 3) && (DAT_006b8d84 <= (int)local_16c)) && ((int)local_16c <= DAT_006b8df4))
      {
        this->_currentSettings->_intParamValues[1] = local_16c;
      }
      setIntParam(this,RATIOTESTER,local_170,true);
      if (this->_currentSettings->_boolParamValues[0] == true) {
        _project(this,local_178);
      }
      _restoreLPReal(this);
      if (this->_hasBasis == true) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setBasis(local_160,(this->_basisStatusRows).data,(this->_basisStatusCols).data);
        this->_hasBasis =
             NO_PROBLEM <
             (this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thestatus;
        SVar3 = this->_status;
        if (SVar3 == INFEASIBLE) {
          if ((this->_solver).m_status == OPTIMAL) {
            (this->_solver).m_status = UNKNOWN;
          }
          if ((this->_solver).
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .thestatus != INFEASIBLE) {
            (this->_solver).
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .thestatus = INFEASIBLE;
          }
        }
        else if (SVar3 == UNBOUNDED) {
          if ((this->_solver).m_status == OPTIMAL) {
            (this->_solver).m_status = UNKNOWN;
          }
          if ((this->_solver).
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .thestatus != UNBOUNDED) {
            (this->_solver).
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .thestatus = UNBOUNDED;
          }
        }
        else if (SVar3 == OPTIMAL) {
          if ((this->_solver).m_status == OPTIMAL) {
            (this->_solver).m_status = UNKNOWN;
          }
          if ((this->_solver).
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .thestatus != OPTIMAL) {
            (this->_solver).
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .thestatus = OPTIMAL;
          }
        }
      }
      (*this->_statistics->initialPrecisionTime->_vptr_Timer[4])();
      (*this->_statistics->extendedPrecisionTime->_vptr_Timer[4])();
      (*this->_statistics->solvingTime->_vptr_Timer[4])();
      return;
    }
  } while( true );
}

Assistant:

void SoPlexBase<R>::_optimizeRational(volatile bool* interrupt)
{
#ifndef SOPLEX_WITH_BOOST
   SPX_MSG_ERROR(std::cerr << "ERROR: rational solve without Boost not defined!" << std::endl;)
   return;
#else
   bool hasUnboundedRay = false;
   bool infeasibilityNotCertified = false;
   bool unboundednessNotCertified = false;

   // start timing
   _statistics->solvingTime->start();
   _statistics->preprocessingTime->start();
   _statistics->initialPrecisionTime->start();

   // remember that last solve was rational
   _lastSolveMode = SOLVEMODE_RATIONAL;
   _resetBoostedPrecision();

   // ensure that the solver has the original problemo
   if(!_isRealLPLoaded)
   {
      assert(_realLP != &_solver);

      _solver.loadLP(*_realLP);
      spx_free(_realLP);
      _realLP = &_solver;
      _isRealLPLoaded = true;
   }
   // during the rational solve, we always store basis information in the basis arrays
   else if(_hasBasis)
   {
      _basisStatusRows.reSize(numRows());
      _basisStatusCols.reSize(numCols());
      _solver.getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(), _basisStatusRows.size(),
                       _basisStatusCols.size());
   }

   // store objective, bounds, and sides of Real LP in case they will be modified during iterative refinement
   _storeLPReal();

   // deactivate objective limit in floating-point solver
   if(realParam(SoPlexBase<R>::OBJLIMIT_LOWER) > -realParam(SoPlexBase<R>::INFTY)
         || realParam(SoPlexBase<R>::OBJLIMIT_UPPER) < realParam(SoPlexBase<R>::INFTY))
   {
      SPX_MSG_INFO2(spxout, spxout << "Deactivating objective limit.\n");
   }

   _solver.setTerminationValue(realParam(SoPlexBase<R>::INFTY));

   _statistics->preprocessingTime->stop();

   // apply lifting to reduce range of nonzero matrix coefficients
   if(boolParam(SoPlexBase<R>::LIFTING))
      _lift();

   // force column representation
   ///@todo implement row objectives with row representation
   int oldRepresentation = intParam(SoPlexBase<R>::REPRESENTATION);
   setIntParam(SoPlexBase<R>::REPRESENTATION, SoPlexBase<R>::REPRESENTATION_COLUMN);

   // force ratio test (avoid bound flipping)
   int oldRatiotester = intParam(SoPlexBase<R>::RATIOTESTER);

   if(oldRatiotester == SoPlexBase<R>::RATIOTESTER_BOUNDFLIPPING)
      setIntParam(SoPlexBase<R>::RATIOTESTER, SoPlexBase<R>::RATIOTESTER_FAST);

   ///@todo implement handling of row objectives in Cplex interface
#ifdef SOPLEX_WITH_CPX
   int oldEqtrans = boolParam(SoPlexBase<R>::EQTRANS);
   setBoolParam(SoPlexBase<R>::EQTRANS, true);
#endif

   // introduce slack variables to transform inequality constraints into equations
   if(boolParam(SoPlexBase<R>::EQTRANS))
      _transformEquality();

   _storedBasis = false;

   bool stoppedTime;
   bool stoppedIter;

   do
   {
      bool primalFeasible = false;
      bool dualFeasible = false;
      bool infeasible = false;
      bool unbounded = false;
      bool error = false;
      stoppedTime = false;
      stoppedIter = false;

      // indicate we are solving the original LP
      _switchToStandardMode();

      /// solve problem with iterative refinement and the right precision
      _performOptIRWrapper(_solRational, !unboundednessNotCertified, !infeasibilityNotCertified, 0,
                           primalFeasible, dualFeasible, infeasible, unbounded, stoppedTime, stoppedIter, error);

#ifdef SOPLEX_WITH_MPFR

      // case: an unrecoverable error occured, and precision boosting has reached its limit
      if(error && _boostingLimitReached)
      {
         _status = SPxSolverBase<R>::ERROR;
         break;
      }
      // case: an error occured, boost precision
      else if(error)
#else

      // case: an unrecoverable error occured, boost precision
      if(error)
#endif
      {
         _status = SPxSolverBase<R>::ERROR;
#ifdef SOPLEX_WITH_MPFR

         if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
         {
            if(_setupBoostedSolverAfterRecovery())
               continue;
            else // precision boosting has reached its limit
               break;
         }
         else
            break;

#else
         break;
#endif
      }
      // case: stopped due to some limit
      else if(stoppedTime)
      {
         _status = SPxSolverBase<R>::ABORT_TIME;
         break;
      }
      else if(stoppedIter)
      {
         _status = SPxSolverBase<R>::ABORT_ITER;
         break;
      }
      // case: unboundedness detected for the first time
      else if(unbounded && !unboundednessNotCertified)
      {
         SolRational solUnbounded;

         // indicate we are testing unboundedness
         _switchToUnbdMode();

         _performUnboundedIRStable(solUnbounded, hasUnboundedRay, stoppedTime, stoppedIter, error);

         assert(!hasUnboundedRay || solUnbounded.hasPrimalRay());
         assert(!solUnbounded.hasPrimalRay() || hasUnboundedRay);

         if(error)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error while testing for unboundedness.\n");
            _status = SPxSolverBase<R>::ERROR;
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }
            else
               break;

#else
            break;
#endif
         }

         if(hasUnboundedRay)
         {
            SPX_MSG_INFO1(spxout, spxout << "Dual infeasible.  Primal unbounded ray available.\n");
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Dual feasible.  Rejecting primal unboundedness.\n");
         }

         unboundednessNotCertified = !hasUnboundedRay;

         if(stoppedTime)
         {
            _status = SPxSolverBase<R>::ABORT_TIME;
            break;
         }
         else if(stoppedIter)
         {
            _status = SPxSolverBase<R>::ABORT_ITER;
            break;
         }

         // indicate we are testing feasibility
         _switchToFeasMode();

         _performFeasIRStable(_solRational, infeasible, stoppedTime, stoppedIter, error);

         ///@todo this should be stored already earlier, possible switch use solRational above and solFeas here
         if(hasUnboundedRay)
         {
            _solRational._primalRay = solUnbounded._primalRay;
            _solRational._hasPrimalRay = true;
         }

         if(error)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error while testing for feasibility.\n");
            _status = SPxSolverBase<R>::ERROR;
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }
            else
               break;

#else
            break;
#endif
         }
         else if(stoppedTime)
         {
            _status = SPxSolverBase<R>::ABORT_TIME;
            break;
         }
         else if(stoppedIter)
         {
            _status = SPxSolverBase<R>::ABORT_ITER;
            break;
         }
         else if(infeasible)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal infeasible.  Dual Farkas ray available.\n");
            _status = SPxSolverBase<R>::INFEASIBLE;
            break;
         }
         else if(hasUnboundedRay)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible and unbounded.\n");
            _status = SPxSolverBase<R>::UNBOUNDED;
            break;
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible and bounded.\n");
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }

#endif
            continue;
         }
      }
      // case: infeasibility detected
      else if(infeasible && !infeasibilityNotCertified)
      {
         _storeBasis();

         // indicate we are testing feasibility
         _switchToFeasMode();

         _performFeasIRStable(_solRational, infeasible, stoppedTime, stoppedIter, error);

         if(error)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error while testing for infeasibility.\n");
            _status = SPxSolverBase<R>::ERROR;
            _restoreBasis();
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }
            else
               break;

#else
            break;
#endif
         }

         infeasibilityNotCertified = !infeasible;

         if(stoppedTime)
         {
            _status = SPxSolverBase<R>::ABORT_TIME;
            _restoreBasis();
            break;
         }
         else if(stoppedIter)
         {
            _status = SPxSolverBase<R>::ABORT_ITER;
            _restoreBasis();
            break;
         }

         if(infeasible && boolParam(SoPlexBase<R>::TESTDUALINF))
         {
            SolRational solUnbounded;

            // indicate we are testing unboundedness
            // not sure about this.
            _switchToUnbdMode();

            _performUnboundedIRStable(solUnbounded, hasUnboundedRay, stoppedTime, stoppedIter, error);

            assert(!hasUnboundedRay || solUnbounded.hasPrimalRay());
            assert(!solUnbounded.hasPrimalRay() || hasUnboundedRay);

            if(error)
            {
               SPX_MSG_INFO1(spxout, spxout << "Error while testing for dual infeasibility.\n");
               _status = SPxSolverBase<R>::ERROR;
               _restoreBasis();
#ifdef SOPLEX_WITH_MPFR

               if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
               {
                  if(_setupBoostedSolverAfterRecovery())
                     continue;
                  else // precision boosting has reached its limit
                     break;
               }
               else
                  break;

#else
               break;
#endif
            }

            if(hasUnboundedRay)
            {
               SPX_MSG_INFO1(spxout, spxout << "Dual infeasible.  Primal unbounded ray available.\n");
               _solRational._primalRay = solUnbounded._primalRay;
               _solRational._hasPrimalRay = true;
            }
            else if(solUnbounded._isDualFeasible)
            {
               SPX_MSG_INFO1(spxout, spxout << "Dual feasible.  Storing dual multipliers.\n");
               _solRational._dual = solUnbounded._dual;
               _solRational._redCost = solUnbounded._redCost;
               _solRational._isDualFeasible = true;
            }
            else
            {
               assert(false);
               SPX_MSG_INFO1(spxout, spxout << "Not dual infeasible.\n");
            }
         }

         _restoreBasis();

         if(infeasible)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal infeasible.  Dual Farkas ray available.\n");
            _status = SPxSolverBase<R>::INFEASIBLE;
            break;
         }
         else if(hasUnboundedRay)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible and unbounded.\n");
            _status = SPxSolverBase<R>::UNBOUNDED;
            break;
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible.  Optimizing again.\n");
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }

#endif
            continue;
         }
      }
      else if(primalFeasible && dualFeasible)
      {
         SPX_MSG_INFO1(spxout, spxout << "Solved to optimality.\n");
         _status = SPxSolverBase<R>::OPTIMAL;
         break;
      }
      else
      {
#ifdef SOPLEX_WITH_MPFR

         if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
         {
            if(_setupBoostedSolverAfterRecovery())
               continue;
            else // precision boosting has reached its limit
               break;
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Terminating without success.\n");
            break;
         }

#else
         SPX_MSG_INFO1(spxout, spxout << "Terminating without success.\n");
         break;
#endif
      }
   }
   while(!_isSolveStopped(stoppedTime, stoppedIter));

   // reset old basis flags for future optimization runs
   _switchedToBoosted = false;
   _hasOldBasis = false;
   _hasOldFeasBasis = false;
   _hasOldUnbdBasis = false;

   ///@todo set status to ABORT_VALUE if optimal solution exceeds objective limit

   if(_status == SPxSolverBase<R>::OPTIMAL || _status == SPxSolverBase<R>::INFEASIBLE
         || _status == SPxSolverBase<R>::UNBOUNDED)
      _hasSolRational = true;

   // restore original problem
   if(boolParam(SoPlexBase<R>::EQTRANS))
      _untransformEquality(_solRational);

#ifdef SOPLEX_WITH_CPX
   setBoolParam(SoPlexBase<R>::EQTRANS, oldEqtrans);
#endif

   // reset representation and ratio test
   setIntParam(SoPlexBase<R>::REPRESENTATION, oldRepresentation);
   setIntParam(SoPlexBase<R>::RATIOTESTER, oldRatiotester);

   // undo lifting
   if(boolParam(SoPlexBase<R>::LIFTING))
      _project(_solRational);

   // restore objective, bounds, and sides of Real LP in case they have been modified during iterative refinement
   _restoreLPReal();

   // since the Real LP is loaded in the solver, we need to also pass the basis information to the solver if
   // available
   if(_hasBasis)
   {
      assert(_isRealLPLoaded);
      _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);

      // since setBasis always sets the basis status to regular, we need to set it manually here
      switch(_status)
      {
      case SPxSolverBase<R>::OPTIMAL:
         _solver.setBasisStatus(SPxBasisBase<R>::OPTIMAL);
         break;

      case SPxSolverBase<R>::INFEASIBLE:
         _solver.setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
         break;

      case SPxSolverBase<R>::UNBOUNDED:
         _solver.setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
         break;

      default:
         break;
      }

   }

   // stop timing
   _statistics->initialPrecisionTime->stop();
   _statistics->extendedPrecisionTime->stop();
   _statistics->solvingTime->stop();
#endif
}

/// perform iterative refinement using the right precision
template <class R>
void SoPlexBase<R>::_performOptIRWrapper(
   SolRational& sol,
   bool acceptUnbounded,
   bool acceptInfeasible,
   int minIRRoundsRemaining,
   bool& primalFeasible,
   bool& dualFeasible,
   bool& infeasible,
   bool& unbounded,
   bool& stoppedTime,
   bool& stoppedIter,
   bool& error
)
{
   _solver.setSolvingForBoosted(boolParam(SoPlexBase<R>::PRECISION_BOOSTING));
   _boostedSolver.setSolvingForBoosted(boolParam(SoPlexBase<R>::PRECISION_BOOSTING));

#ifdef SOPLEX_WITH_MPFR

   if(boolParam(SoPlexBase<R>::ITERATIVE_REFINEMENT))
   {
      // no precision boosting or initial precision -> solve with plain iterative refinement
      if(!boolParam(SoPlexBase<R>::PRECISION_BOOSTING) || !_switchedToBoosted)
      {
         _performOptIRStable(sol, acceptUnbounded, acceptInfeasible, minIRRoundsRemaining,
                             primalFeasible, dualFeasible, infeasible, unbounded, stoppedTime, stoppedIter, error);
      }
      else
      {
         do
         {
            // setup boosted solver for the new iteration
            _setupBoostedSolver();
            // solve problem with iterative refinement and recovery mechanism, using multiprecision
            // return false if a new boosted iteration is needed, true otherwise
            bool needNewBoostedIt;
            _performOptIRStableBoosted(sol, acceptUnbounded, acceptInfeasible, minIRRoundsRemaining,
                                       primalFeasible, dualFeasible, infeasible, unbounded, stoppedTime, stoppedIter, error,
                                       needNewBoostedIt);

            // update statistics for precision boosting
            _updateBoostingStatistics();

            // boost precision if no success
            if(needNewBoostedIt)
            {
               if(!_boostPrecision())
               {
                  // error message already displayed
                  error = true;
                  break;
               }
            }
            else
               break;
         }
         while(true);
      }